

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int add_pattern(yr_pattern **patterns,int *counter,char *pattern)

{
  int iVar1;
  yr_pattern *pyVar2;
  char *pcVar3;
  int orig_counter;
  void *reallocated;
  char *pattern_local;
  int *counter_local;
  yr_pattern **patterns_local;
  
  iVar1 = *counter;
  pyVar2 = (yr_pattern *)realloc(*patterns,(long)(iVar1 + 1) << 4);
  if (pyVar2 != (yr_pattern *)0x0) {
    *patterns = pyVar2;
    *counter = *counter + 1;
    pcVar3 = strdup(pattern);
    (*patterns)[iVar1].expr = pcVar3;
    if ((*patterns)[iVar1].expr != (char *)0x0) {
      (*patterns)[iVar1].invert = '\0';
      return 0;
    }
  }
  fprintf(_stderr,"yangre error: memory allocation error.\n");
  return 1;
}

Assistant:

static int
add_pattern(struct yr_pattern **patterns, int *counter, char *pattern)
{
    void *reallocated;
    int orig_counter;

    /* Store the original number of items. */
    orig_counter = *counter;

    /* Reallocate 'patterns' memory with additional space. */
    reallocated = realloc(*patterns, (orig_counter + 1) * sizeof **patterns);
    if (!reallocated) {
        goto error;
    }
    (*patterns) = reallocated;
    /* Allocated memory is now larger. */
    (*counter)++;
    /* Copy the pattern and store it to the additonal space. */
    (*patterns)[orig_counter].expr = strdup(pattern);
    if (!(*patterns)[orig_counter].expr) {
        goto error;
    }
    (*patterns)[orig_counter].invert = 0;

    return 0;

error:
    fprintf(stderr, "yangre error: memory allocation error.\n");
    return 1;
}